

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::While_AST_Node::eval_internal(While_AST_Node *this,Dispatch_State *t_ss)

{
  element_type *peVar1;
  bool bVar2;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar3;
  Scope_Push_Pop spp;
  Scope_Push_Pop local_60;
  element_type *local_58;
  undefined1 local_50 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_58 = (element_type *)this;
  detail::Scope_Push_Pop::Scope_Push_Pop(&local_60,in_RDX);
  while( true ) {
    AST_Node::eval((AST_Node *)local_50,
                   (Dispatch_State *)
                   ((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex.
                   __align);
    bVar2 = AST_Node::get_bool_condition((Boxed_Value *)local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
    peVar1 = local_58;
    if (!bVar2) break;
    AST_Node::eval((AST_Node *)(local_50 + 0x10),
                   *(Dispatch_State **)
                    ((long)&((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base.
                            _M_mutex + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  }
  Boxed_Value::Object_Data::get();
  detail::Scope_Push_Pop::~Scope_Push_Pop(&local_60);
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar1;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE {
          chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);

          try {
            while (get_bool_condition(this->children[0]->eval(t_ss))) {
              try {
                this->children[1]->eval(t_ss);
              } catch (detail::Continue_Loop &) {
                // we got a continue exception, which means all of the remaining 
                // loop implementation is skipped and we just need to continue to
                // the next condition test
              }
            } 
          } catch (detail::Break_Loop &) {
            // loop was broken intentionally
          }

          return Boxed_Value();
        }